

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall
SourceMapTest::ExpectDbgLocEq
          (SourceMapTest *this,size_t location,BinaryLocation file,BinaryLocation line,
          BinaryLocation col,optional<unsigned_int> sym)

{
  bool bVar1;
  __rvalue_stream_insertion_t<std::__cxx11::basic_stringstream<char>,_char[11]> __os;
  __rvalue_stream_insertion_t<std::__cxx11::basic_stringstream<char>,_unsigned_long> pbVar2;
  char *pcVar3;
  DebugLocation *pDVar4;
  AssertHelper local_458;
  Message local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_3;
  Message local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_2;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_1;
  Message local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar;
  string local_3d0;
  AssertHelper local_3b0;
  Message local_3a8;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_;
  optional<wasm::Function::DebugLocation> loc;
  ScopedTrace local_34d [8];
  ScopedTrace gtest_trace_49;
  stringstream local_340 [392];
  stringstream local_1b8 [8];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> loc_str;
  BinaryLocation local_2c;
  BinaryLocation local_28;
  BinaryLocation col_local;
  BinaryLocation line_local;
  BinaryLocation file_local;
  size_t location_local;
  SourceMapTest *this_local;
  optional<unsigned_int> sym_local;
  
  local_2c = col;
  local_28 = line;
  col_local = file;
  _line_local = location;
  location_local = (size_t)this;
  this_local = (SourceMapTest *)
               sym.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>;
  std::__cxx11::stringstream::stringstream(local_340);
  __os = std::operator<<((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340,(char (*) [11])"location: ");
  pbVar2 = std::operator<<(__os,(unsigned_long *)&line_local);
  std::__cxx11::stringstream::stringstream(local_1b8,(stringstream *)pbVar2);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::__cxx11::stringstream::str();
  testing::ScopedTrace::ScopedTrace
            (local_34d,
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
             ,0x31,(string *)
                   ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                           _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                           _M_payload._M_value.symbolNameIndex.
                           super__Optional_base<unsigned_int,_true,_true> + 4));
  std::__cxx11::string::~string
            ((string *)
             ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value
                     .symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4));
  std::unique_ptr<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>::operator->
            (&this->reader);
  ::wasm::SourceMapReader::readDebugLocationAt((ulong)&gtest_ar_.message_);
  local_399 = std::optional<wasm::Function::DebugLocation>::has_value
                        ((optional<wasm::Function::DebugLocation> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_398,&local_399,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3d0,(internal *)local_398,(AssertionResult *)"loc.has_value()","false","true",
               (char *)sym.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    testing::Message::~Message(&local_3a8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                       ((optional<wasm::Function::DebugLocation> *)&gtest_ar_.message_);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_3e8,"loc->fileIndex","file",&pDVar4->fileIndex,&col_local);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
                 ,0x34,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
    pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                       ((optional<wasm::Function::DebugLocation> *)&gtest_ar_.message_);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_408,"loc->lineNumber","line",&pDVar4->lineNumber,&local_28);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
    if (!bVar1) {
      testing::Message::Message(&local_410);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
                 ,0x35,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_410);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_410);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
    pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                       ((optional<wasm::Function::DebugLocation> *)&gtest_ar_.message_);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_428,"loc->columnNumber","col",&pDVar4->columnNumber,&local_2c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar1) {
      testing::Message::Message(&local_430);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
                 ,0x36,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_430);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    pDVar4 = std::optional<wasm::Function::DebugLocation>::operator->
                       ((optional<wasm::Function::DebugLocation> *)&gtest_ar_.message_);
    testing::internal::EqHelper::
    Compare<std::optional<unsigned_int>,_std::optional<unsigned_int>,_nullptr>
              ((EqHelper *)local_448,"loc->symbolNameIndex","sym",&pDVar4->symbolNameIndex,
               (optional<unsigned_int> *)&this_local);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar1) {
      testing::Message::Message(&local_450);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
      testing::internal::AssertHelper::AssertHelper
                (&local_458,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
                 ,0x37,pcVar3);
      testing::internal::AssertHelper::operator=(&local_458,&local_450);
      testing::internal::AssertHelper::~AssertHelper(&local_458);
      testing::Message::~Message(&local_450);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  testing::ScopedTrace::~ScopedTrace(local_34d);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void ExpectDbgLocEq(size_t location,
                      BinaryLocation file,
                      BinaryLocation line,
                      BinaryLocation col,
                      std::optional<BinaryLocation> sym) {
    auto loc_str = std::stringstream() << "location: " << location;
    SCOPED_TRACE(loc_str.str());
    auto loc = reader->readDebugLocationAt(location);
    ASSERT_TRUE(loc.has_value());
    EXPECT_EQ(loc->fileIndex, file);
    EXPECT_EQ(loc->lineNumber, line);
    EXPECT_EQ(loc->columnNumber, col);
    EXPECT_EQ(loc->symbolNameIndex, sym);
  }